

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O2

void Diligent::
     LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[28],char_const*,char[35],std::__cxx11::string,char[71],std::__cxx11::string,char[73]>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,char (*Args) [16],
               char **Args_1,char (*Args_2) [7],char **Args_3,char (*Args_4) [15],
               char (*Args_5) [28],char **Args_6,char (*Args_7) [35],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_8,
               char (*Args_9) [71],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_10,
               char (*Args_11) [73])

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  char (*Args_11_00) [73];
  string Msg;
  string FileName;
  
  std::__cxx11::string::string((string *)&FileName,FullFilePath,(allocator *)&Msg);
  Args_11_00 = (char (*) [73])0x238d38;
  lVar1 = std::__cxx11::string::find_last_of((char *)&FileName,0x2b5513);
  if (lVar1 != -1) {
    Args_11_00 = (char (*) [73])0x238d50;
    std::__cxx11::string::erase((ulong)&FileName,0);
  }
  FormatString<char[16],char_const*,char[7],char_const*,char[15],char[28],char_const*,char[35],std::__cxx11::string,char[71],std::__cxx11::string,char[73]>
            (&Msg,(Diligent *)Args,(char (*) [16])Args_1,(char **)Args_2,(char (*) [7])Args_3,
             (char **)Args_4,(char (*) [15])Args_5,(char (*) [28])Args_6,(char **)Args_7,
             (char (*) [35])Args_8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_9,
             (char (*) [71])Args_10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_11,Args_11_00
            );
  if (DebugMessageCallback == (undefined *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Diligent Engine: ");
    pcVar3 = "Error";
    if (IsFatal) {
      pcVar3 = "Fatal Error";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,Function);
    poVar2 = std::operator<<(poVar2,"() (");
    poVar2 = std::operator<<(poVar2,(string *)&FileName);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Line);
    poVar2 = std::operator<<(poVar2,"): ");
    poVar2 = std::operator<<(poVar2,(string *)&Msg);
    std::operator<<(poVar2,'\n');
  }
  else {
    (*(code *)DebugMessageCallback)
              (IsFatal | 2,Msg._M_dataplus._M_p,Function,FileName._M_dataplus._M_p,Line);
  }
  ThrowIf<true>(&Msg);
  std::__cxx11::string::~string((string *)&Msg);
  std::__cxx11::string::~string((string *)&FileName);
  return;
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}